

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O3

void __thiscall
duckdb::SingleFileBlockManager::ReadAndChecksum
          (SingleFileBlockManager *this,FileBuffer *block,uint64_t location,bool skip_block_header)

{
  idx_t iVar1;
  type handle;
  IOException *this_00;
  long lVar2;
  uint64_t uVar3;
  data_ptr_t buffer;
  unsigned_long params_1;
  string local_50;
  
  if ((this->super_BlockManager).block_header_size.index == 0xffffffffffffffff) {
    iVar1 = 8;
  }
  else {
    iVar1 = optional_idx::GetIndex(&(this->super_BlockManager).block_header_size);
  }
  handle = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator*
                     (&this->handle);
  FileBuffer::Read(block,handle,location);
  lVar2 = iVar1 - 8;
  if (skip_block_header && lVar2 != 0) {
    params_1 = *(unsigned_long *)block->internal_buffer;
    buffer = block->buffer + (8 - iVar1);
    uVar3 = lVar2 + block->size;
  }
  else {
    params_1 = *(unsigned_long *)((long)block->internal_buffer + lVar2);
    buffer = block->buffer;
    uVar3 = block->size;
  }
  uVar3 = Checksum(buffer,uVar3);
  if (params_1 == uVar3) {
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "Corrupt database file: computed checksum %llu does not match stored checksum %llu in block at location %llu"
             ,"");
  IOException::IOException<unsigned_long,unsigned_long,unsigned_long>
            (this_00,&local_50,uVar3,params_1,location);
  __cxa_throw(this_00,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SingleFileBlockManager::ReadAndChecksum(FileBuffer &block, uint64_t location, bool skip_block_header) const {
	//! calculate delta header bytes (if any)
	uint64_t delta = GetBlockHeaderSize() - Storage::DEFAULT_BLOCK_HEADER_SIZE;

	// read the buffer from disk
	block.Read(*handle, location);
	uint64_t stored_checksum;
	uint64_t computed_checksum;

	if (skip_block_header && delta > 0) {
		// This happens ONLY for the main database header
		stored_checksum = Load<uint64_t>(block.InternalBuffer());
		computed_checksum = Checksum(block.buffer - delta, block.Size() + delta);
	} else {
		stored_checksum = Load<uint64_t>(block.InternalBuffer() + delta);
		computed_checksum = Checksum(block.buffer, block.Size());
	}

	// verify the checksum
	if (stored_checksum != computed_checksum) {
		throw IOException("Corrupt database file: computed checksum %llu does not match stored checksum %llu in block "
		                  "at location %llu",
		                  computed_checksum, stored_checksum, location);
	}
}